

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::~ArrayBuilder
          (ArrayBuilder<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *this)

{
  MemberInfo **ppMVar1;
  RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *ppMVar2;
  MemberInfo **ppMVar3;
  
  ppMVar1 = this->ptr;
  if (ppMVar1 != (MemberInfo **)0x0) {
    ppMVar2 = this->pos;
    ppMVar3 = this->endPtr;
    this->ptr = (MemberInfo **)0x0;
    this->pos = (RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *)0x0;
    this->endPtr = (MemberInfo **)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,ppMVar1,8,(long)ppMVar2 - (long)ppMVar1 >> 3,
               (long)ppMVar3 - (long)ppMVar1 >> 3,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }